

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

uint32_t __thiscall kratos::VarDuplicated::width(VarDuplicated *this)

{
  int iVar1;
  element_type *this_00;
  int64_t iVar2;
  undefined1 local_20 [8];
  shared_ptr<kratos::Const> count;
  VarDuplicated *this_local;
  
  count.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  Var::as<kratos::Const>((Var *)local_20);
  this_00 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_20);
  iVar2 = Const::value(this_00);
  iVar1 = (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[7])();
  std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_20);
  return (int)iVar2 * iVar1;
}

Assistant:

uint32_t VarDuplicated::width() const {
    auto count = right->as<Const>();
    return static_cast<uint32_t>(count->value()) * left->width();
}